

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpthreaddelegate_p.cpp
# Opt level: O2

void QNonContiguousByteDeviceThreadForwardImpl::qt_static_metacall
               (QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QNonContiguousByteDeviceThreadForwardImpl::*)(long_long)>
                      ((QtMocHelpers *)_a,(void **)wantData,0,0);
    if ((!bVar1) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QNonContiguousByteDeviceThreadForwardImpl::*)(long_long,long_long)>
                          ((QtMocHelpers *)_a,(void **)processedData,0,1), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QNonContiguousByteDeviceThreadForwardImpl::*)(bool*)>
                ((QtMocHelpers *)_a,(void **)resetData,0,2);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      wantData((QNonContiguousByteDeviceThreadForwardImpl *)_o,*_a[1]);
      return;
    case 1:
      processedData((QNonContiguousByteDeviceThreadForwardImpl *)_o,*_a[1],*_a[2]);
      return;
    case 2:
      resetData((QNonContiguousByteDeviceThreadForwardImpl *)_o,*_a[1]);
      return;
    case 3:
      haveDataSlot((QNonContiguousByteDeviceThreadForwardImpl *)_o,*_a[1],(QByteArray *)_a[2],*_a[3]
                   ,*_a[4]);
      return;
    }
  }
  return;
}

Assistant:

void QNonContiguousByteDeviceThreadForwardImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNonContiguousByteDeviceThreadForwardImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->wantData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 1: _t->processedData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 2: _t->resetData((*reinterpret_cast< std::add_pointer_t<bool*>>(_a[1]))); break;
        case 3: _t->haveDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[4]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(qint64 )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::wantData, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(qint64 , qint64 )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::processedData, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(bool * )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::resetData, 2))
            return;
    }
}